

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QDBusListener::DBusKey>::moveAppend
          (QGenericArrayOps<QDBusListener::DBusKey> *this,DBusKey *b,DBusKey *e)

{
  qsizetype *pqVar1;
  DBusKey *pDVar2;
  
  if (b != e) {
    pDVar2 = (this->super_QArrayDataPointer<QDBusListener::DBusKey>).ptr;
    for (; b < e; b = b + 1) {
      QDBusListener::DBusKey::DBusKey
                (pDVar2 + (this->super_QArrayDataPointer<QDBusListener::DBusKey>).size,b);
      pqVar1 = &(this->super_QArrayDataPointer<QDBusListener::DBusKey>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }